

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.h
# Opt level: O0

bool __thiscall GouraudShader::fragment(GouraudShader *this,Model *model,vec3f bar,TGAColor *color)

{
  TGAColor TVar1;
  TGAColor local_32 [2];
  double local_28;
  double intensity;
  TGAColor *color_local;
  Model *model_local;
  GouraudShader *this_local;
  
  intensity = (double)color;
  color_local = (TGAColor *)model;
  model_local = (Model *)this;
  local_28 = dot<3ul,double>(&this->varying_ity,&bar);
  TGAColor::TGAColor(local_32,0xff,0xff,0xff,0xff);
  TVar1 = TGAColor::operator*(local_32,local_28);
  *(uint8_t (*) [4])intensity = TVar1.bgra;
  *(uint8_t *)((long)intensity + 4) = TVar1.bytespp;
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        double intensity = dot(varying_ity, bar);
        color = TGAColor(255, 255, 255) * intensity;
        return false;
    }